

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:1179:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:1179:3)>
            *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:1179:3)>_2
  loaderCallback;
  
  if ((this->maybeFunc).ptr.isSet == true) {
    loaderCallback = (this->maybeFunc).ptr.field_1;
    (this->maybeFunc).ptr.isSet = false;
    capnp::compiler::Compiler::Impl::Workspace::Workspace
              ((Workspace *)((long)loaderCallback + 0x68),(LazyLoadCallback *)loaderCallback);
    return;
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }